

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::pushAnnotation(PrintC *this,Varnode *vn,PcodeOp *op)

{
  int iVar1;
  pointer ppVVar2;
  Architecture *pAVar3;
  ScopeLocal *this_00;
  Translate *pTVar4;
  SymbolEntry *pSVar5;
  Datatype *pDVar6;
  Varnode *pVVar7;
  uint size;
  string regname;
  string local_70;
  Atom local_50;
  
  size = 0;
  if (op->opcode->opcode != CPUI_CALLOTHER) goto LAB_0030404e;
  ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar1 = (int)((*ppVVar2)->loc).offset;
  pAVar3 = (this->super_PrintLanguage).glb;
  if ((((pAVar3->userops).vol_write)->super_VolatileOp).super_UserPcodeOp.useropindex == iVar1) {
    pVVar7 = ppVVar2[2];
  }
  else {
    size = 0;
    if ((((pAVar3->userops).vol_read)->super_VolatileOp).super_UserPcodeOp.useropindex != iVar1)
    goto LAB_0030404e;
    pVVar7 = op->output;
    if (pVVar7 == (Varnode *)0x0) {
      size = 1;
      goto LAB_0030404e;
    }
  }
  size = pVVar7->size;
LAB_0030404e:
  this_00 = op->parent->data->localmap;
  if (size == 0) {
    pSVar5 = Scope::queryContainer((Scope *)this_00,&vn->loc,1,&(op->start).pc);
    if (pSVar5 == (SymbolEntry *)0x0) {
      size = vn->size;
      pSVar5 = (SymbolEntry *)0x0;
    }
    else {
      size = pSVar5->size;
    }
  }
  else {
    pSVar5 = Scope::queryContainer((Scope *)this_00,&vn->loc,size,&(op->start).pc);
  }
  if (pSVar5 == (SymbolEntry *)0x0) {
    pTVar4 = ((this->super_PrintLanguage).glb)->translate;
    (*(pTVar4->super_AddrSpaceManager)._vptr_AddrSpaceManager[8])
              (&local_70,pTVar4,(vn->loc).base,(vn->loc).offset,(ulong)size);
    if (local_70._M_string_length == 0) {
      pDVar6 = TypeFactory::getBase(((this->super_PrintLanguage).glb)->types,size,TYPE_UINT);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[2])
                (this,(vn->loc).offset / (ulong)((vn->loc).base)->wordsize,pDVar6,vn,op);
    }
    else {
      local_50.type = vartoken;
      local_50.highlight = var_color;
      local_50.name = &local_70;
      local_50.op = op;
      local_50.ptr_second.vn = vn;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    if (pSVar5->size == size) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[5])(this,pSVar5->symbol,vn,op);
      return;
    }
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[7])
              (this,pSVar5->symbol,(ulong)(uint)((int)(vn->loc).offset - (int)(pSVar5->addr).offset)
               ,(ulong)size,vn,op,0);
  }
  return;
}

Assistant:

void PrintC::pushAnnotation(const Varnode *vn,const PcodeOp *op)

{
  const Scope *scope = op->getParent()->getFuncdata()->getScopeLocal();
  int4 size = 0;
  if (op->code() == CPUI_CALLOTHER) {
  // This construction is for volatile CALLOTHERs where the input annotation is the original address
  // of the volatile access
    int4 userind = (int4)op->getIn(0)->getOffset();
    VolatileWriteOp *vw_op = glb->userops.getVolatileWrite();
    VolatileReadOp *vr_op = glb->userops.getVolatileRead();
    if (userind == vw_op->getIndex()) {	// Annotation from a volatile write
      size = op->getIn(2)->getSize(); // Get size from the 3rd parameter of write function
    }
    else if (userind == vr_op->getIndex()) {
      const Varnode *outvn = op->getOut();
      if (outvn != (const Varnode *)0)
	size = op->getOut()->getSize(); // Get size from output of read function
      else
	size = 1;
    }
  }
  SymbolEntry *entry;
  if (size != 0)
    entry = scope->queryContainer(vn->getAddr(),size,op->getAddr());
  else {
    entry = scope->queryContainer(vn->getAddr(),1,op->getAddr());
    if (entry != (SymbolEntry *)0)
      size = entry->getSize();
    else
      size = vn->getSize();
  }
  
  if (entry != (SymbolEntry *)0) {
    if (entry->getSize() == size)
      pushSymbol(entry->getSymbol(),vn,op);
    else {
      int4 symboloff = vn->getOffset() - entry->getFirst();
      pushPartialSymbol(entry->getSymbol(),symboloff,size,vn,op,(Datatype *)0);
    }
  }
  else {
    string regname = glb->translate->getRegisterName(vn->getSpace(),vn->getOffset(),size);
    if (regname.empty()) {
      Datatype *ct = glb->types->getBase(size,TYPE_UINT);
      pushConstant(AddrSpace::byteToAddress(vn->getOffset(),vn->getSpace()->getWordSize()),ct,vn,op);
    }
    else
      pushAtom(Atom(regname,vartoken,EmitXml::var_color,op,vn));
  }
}